

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void duckdb_fmt::v6::internal::check_pointer_type_spec<char,duckdb_fmt::v6::internal::error_handler>
               (char spec,error_handler *eh)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char in_DIL;
  undefined4 in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff78;
  error_handler *in_stack_ffffffffffffff80;
  allocator local_71;
  string local_70 [112];
  
  if ((in_DIL != '\0') && (in_DIL != 'p')) {
    iVar1 = (int)in_DIL;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,1,(char)iVar1,&local_71);
    std::operator+((char *)CONCAT44(iVar1,in_stack_ffffffffffffff68),in_RSI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar1,in_stack_ffffffffffffff68),(char *)in_RSI);
    error_handler::on_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void check_pointer_type_spec(Char spec, ErrorHandler&& eh) {
  if (spec != 0 && spec != 'p') eh.on_error("Invalid type specifier \"" + std::string(1, spec) + "\" for formatting a value of type pointer");
}